

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wav.cpp
# Opt level: O0

void __thiscall WavPrivate::WavHeader::WavHeader(WavHeader *this)

{
  WavHeader *this_local;
  
  builtin_strncpy(this->riffId,"RIFF",4);
  this->chunkSize = 0;
  builtin_strncpy(this->waveId,"WAVE",4);
  builtin_strncpy(this->fmtId,"fmt ",4);
  this->fmtChunkSize = 0x12;
  this->fmtTag = 3;
  this->fmtChannels = 0;
  this->fmtSampleRate = 0;
  this->fmtAvgBytesPerSec = 0;
  this->fmtBlockAlign = 0;
  this->fmtBitsPerSample = 0x20;
  this->fmtCbSize = 0;
  builtin_strncpy(this->factId,"fact",4);
  this->factChunkSize = 4;
  this->factSampleCount = 0;
  builtin_strncpy(this->dataId,"data",4);
  this->dataChunkSize = 0;
  return;
}

Assistant:

WavHeader() :
        riffId{'R', 'I', 'F', 'F'},
        chunkSize(0),
        waveId{'W', 'A', 'V', 'E'},
        fmtId{'f', 'm', 't', ' '},
        fmtChunkSize(18),
        fmtTag(0x3),
        fmtChannels(0),
        fmtSampleRate(0),
        fmtAvgBytesPerSec(0),
        fmtBlockAlign(0),
        fmtBitsPerSample(32),
        fmtCbSize(0),
        factId{'f', 'a', 'c', 't'},
        factChunkSize(4),
        factSampleCount(0),
        dataId{'d', 'a', 't', 'a'},
        dataChunkSize(0)
    {
    }